

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll.cpp
# Opt level: O0

int __thiscall ncnn::BNLL::forward_inplace(BNLL *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  long in_RSI;
  double dVar6;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int local_90;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_2c;
  
  iVar2 = *(int *)(in_RSI + 0x2c);
  iVar3 = *(int *)(in_RSI + 0x30);
  iVar4 = *(int *)(in_RSI + 0x38);
  for (local_2c = 0; local_2c < iVar4; local_2c = local_2c + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    pfVar5 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff80);
    ncnn::Mat::~Mat((Mat *)0x19992a);
    for (local_90 = 0; local_90 < iVar2 * iVar3; local_90 = local_90 + 1) {
      if (pfVar5[local_90] <= 0.0) {
        dVar6 = std::exp((double)(ulong)(uint)pfVar5[local_90]);
        dVar6 = std::log((double)(ulong)(uint)(SUB84(dVar6,0) + 1.0));
        pfVar5[local_90] = SUB84(dVar6,0);
      }
      else {
        fVar1 = pfVar5[local_90];
        dVar6 = std::exp((double)(ulong)(uint)-pfVar5[local_90]);
        dVar6 = std::log((double)(ulong)(uint)(SUB84(dVar6,0) + 1.0));
        pfVar5[local_90] = fVar1 + SUB84(dVar6,0);
      }
    }
  }
  return 0;
}

Assistant:

int BNLL::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] > 0)
                ptr[i] = static_cast<float>(ptr[i] + log(1.f + exp(-ptr[i])));
            else
                ptr[i] = static_cast<float>(log(1.f + exp(ptr[i])));
        }
    }

    return 0;
}